

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

ostream * __thiscall nivalis::Plotter::export_binary_func_and_env(Plotter *this,ostream *os)

{
  pointer pFVar1;
  ulong uVar2;
  long lVar3;
  size_t local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_58 = this->curr_func;
  std::ostream::write((char *)os,(long)&local_58);
  local_58 = ((long)(this->funcs).
                    super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->funcs).
                    super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5;
  std::ostream::write((char *)os,(long)&local_58);
  pFVar1 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
      _M_impl.super__Vector_impl_data._M_finish != pFVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      Function::to_bin((Function *)((long)(pFVar1->line_color).data + lVar3 + -0x20),os);
      uVar2 = uVar2 + 1;
      pFVar1 = (this->funcs).
               super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x130;
    } while (uVar2 < (ulong)(((long)(this->funcs).
                                    super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4)
                            * -0x79435e50d79435e5));
  }
  local_38 = (this->view).ymin;
  local_58._0_4_ = (this->view).swid;
  local_58._4_4_ = (this->view).shigh;
  dStack_50 = (this->view).xmax;
  local_48 = (this->view).xmin;
  dStack_40 = (this->view).ymax;
  std::ostream::write((char *)os,(long)&local_58);
  local_58._0_4_ = this->x_var;
  std::ostream::write((char *)os,(long)&local_58);
  local_58._0_4_ = this->y_var;
  std::ostream::write((char *)os,(long)&local_58);
  local_58._0_4_ = this->t_var;
  std::ostream::write((char *)os,(long)&local_58);
  local_58 = CONCAT44(local_58._4_4_,this->r_var);
  std::ostream::write((char *)os,(long)&local_58);
  Environment::to_bin(&this->env,os);
  return os;
}

Assistant:

std::ostream& Plotter::export_binary_func_and_env(std::ostream& os) const {
    util::write_bin(os, curr_func);
    util::write_bin(os, funcs.size());
    for (size_t i = 0; i < funcs.size(); ++i) {
        funcs[i].to_bin(os);
    }
    util::write_bin(os, view);
    util::write_bin(os, x_var);
    util::write_bin(os, y_var);
    util::write_bin(os, t_var);
    util::write_bin(os, r_var);
    env.to_bin(os);
    return os;
}